

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O3

void __thiscall cppcms::widgets::checkbox::checkbox(checkbox *this,string *type)

{
  uint *puVar1;
  
  base_widget::base_widget((base_widget *)&(this->super_base_html_input).field_0x60);
  base_html_input::base_html_input
            (&this->super_base_html_input,&PTR_construction_vtable_24__00287070,type);
  (this->super_base_html_input)._vptr_base_html_input = (_func_int **)&PTR__checkbox_00286f98;
  *(undefined ***)&(this->super_base_html_input).field_0x60 = &PTR_render_00287018;
  *(undefined8 *)&(this->super_base_html_input).field_0x30 = 0;
  *(undefined1 **)&(this->super_base_html_input).field_0x38 =
       &(this->super_base_html_input).field_0x48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->super_base_html_input).field_0x38,"y","");
  (this->super_base_html_input).field_0x58 = 0;
  puVar1 = (uint *)(&(this->super_base_html_input).field_0x1f0 +
                   (long)(this->super_base_html_input)._vptr_base_html_input[-3]);
  *puVar1 = *puVar1 | 2;
  return;
}

Assistant:

checkbox::checkbox(std::string const &type) : 
	base_html_input(type),
	identification_("y"),
	value_(false)
{
	set(true);	
}